

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_protocol.cc
# Opt level: O0

void __thiscall
helix::nasdaq::nordic_itch_protocol::nordic_itch_protocol(nordic_itch_protocol *this,string *name)

{
  string *in_RSI;
  protocol *in_RDI;
  
  protocol::protocol(in_RDI);
  in_RDI->_vptr_protocol = (_func_int **)&PTR__nordic_itch_protocol_00163bb8;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  return;
}

Assistant:

nordic_itch_protocol::nordic_itch_protocol(std::string name)
    : _name{std::move(name)}
{
}